

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

json lrit::toJSON_abi_cxx11_(File *f)

{
  HeaderMap *this;
  json_value extraout_RDX;
  File *in_RSI;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_RDI;
  json jVar1;
  HeaderMap m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  HeaderMap *in_stack_00000310;
  Buffer *in_stack_00000318;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  File::getHeaderBuffer(in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this = File::getHeaderMap(in_RSI);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (this_00,in_stack_ffffffffffffff78);
  toJSON_abi_cxx11_(in_stack_00000318,in_stack_00000310);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x18172a)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  jVar1.m_value.object = extraout_RDX.object;
  jVar1._0_8_ = in_RDI;
  return jVar1;
}

Assistant:

json toJSON(const File& f) {
  auto b = f.getHeaderBuffer();
  auto m = f.getHeaderMap();
  return toJSON(b, m);
}